

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O2

void __thiscall clunk::Node::GetKnightMoves<true>(Node *this,Color color,int from,int depth)

{
  byte bVar1;
  byte *pbVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  uint to;
  uint cap;
  ulong uVar6;
  int local_50;
  
  if (this->checks != 0) {
    __assert_fail("!checks",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x685,
                  "void clunk::Node::GetKnightMoves(const Color, const int, const int) [qsearch = true]"
                 );
  }
  if ((from & 0xffffff88U) != 0) {
    __assert_fail("IS_SQUARE(from)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x686,
                  "void clunk::Node::GetKnightMoves(const Color, const int, const int) [qsearch = true]"
                 );
  }
  uVar4 = (ulong)(uint)from;
  pbVar2 = (byte *)(&_board)[uVar4];
  if (pbVar2 == _EMPTY) {
    __assert_fail("_board[from] != _EMPTY",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x687,
                  "void clunk::Node::GetKnightMoves(const Color, const int, const int) [qsearch = true]"
                 );
  }
  if (color + 4 != (uint)*pbVar2) {
    __assert_fail("_board[from]->type == (color|Knight)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x688,
                  "void clunk::Node::GetKnightMoves(const Color, const int, const int) [qsearch = true]"
                 );
  }
  if ((uint)pbVar2[1] != from) {
    __assert_fail("_board[from]->sqr == from",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x689,
                  "void clunk::Node::GetKnightMoves(const Color, const int, const int) [qsearch = true]"
                 );
  }
  iVar3 = GetPinDir(this,color,from);
  if (iVar3 == 0) {
    local_50 = 0;
    if (depth == 0) {
      local_50 = GetDiscoverDir(this,color,from);
    }
    for (uVar5 = *(ulong *)(_knightMoves + uVar4 * 8); uVar5 != 0; uVar5 = uVar5 >> 8) {
      if ((uVar5 & 0xff) == 0) {
        __assert_fail("mvs & 0xFF",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x695,
                      "void clunk::Node::GetKnightMoves(const Color, const int, const int) [qsearch = true]"
                     );
      }
      to = (int)(uVar5 & 0xff) - 1;
      if ((to & 0xffffff88) != 0) {
        __assert_fail("IS_SQUARE(to)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x697,
                      "void clunk::Node::GetKnightMoves(const Color, const int, const int) [qsearch = true]"
                     );
      }
      if (to == from) {
        __assert_fail("to != from",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x698,
                      "void clunk::Node::GetKnightMoves(const Color, const int, const int) [qsearch = true]"
                     );
      }
      uVar6 = (ulong)to;
      bVar1 = *(byte *)(&_board)[uVar6];
      cap = (uint)bVar1;
      if ((bVar1 == 0) && ((byte *)(&_board)[uVar6] != _EMPTY)) {
        __assert_fail("cap || (_board[to] == _EMPTY)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x69a,
                      "void clunk::Node::GetKnightMoves(const Color, const int, const int) [qsearch = true]"
                     );
      }
      if (bVar1 == 0) {
        if (depth == 0) {
          iVar3 = IsKnightMove((uint)(byte)(&_KING)[!color][1],to);
          if (iVar3 != 0 || local_50 != 0) {
            iVar3 = (*(int *)(_SQR + uVar6 * 4) - *(int *)(_SQR + uVar4 * 4)) + 0x14;
            cap = 0;
            goto LAB_0012c799;
          }
        }
      }
      else if ((Color)(bVar1 & 1) != color) {
        iVar3 = ValueOf((uint)bVar1);
        iVar3 = ((iVar3 + *(int *)(_SQR + uVar6 * 4)) - *(int *)(_SQR + uVar4 * 4)) + -0x20;
LAB_0012c799:
        AddMove(this,KnightMove,from,to,iVar3,cap,0);
      }
    }
  }
  return;
}

Assistant:

void GetKnightMoves(const Color color, const int from, const int depth) {
    assert(!checks);
    assert(IS_SQUARE(from));
    assert(_board[from] != _EMPTY);
    assert(_board[from]->type == (color|Knight));
    assert(_board[from]->sqr == from);
    if (GetPinDir(color, from)) {
      return;
    }

    int kdir = 0;
    if (qsearch && !depth) {
      kdir = GetDiscoverDir(color, from);
    }

    int score;
    for (uint64_t mvs = _knightMoves[from]; mvs; mvs >>= 8) {
      assert(mvs & 0xFF);
      const int to = ((mvs & 0xFF) - 1);
      assert(IS_SQUARE(to));
      assert(to != from);
      const int cap = _board[to]->type;
      assert(cap || (_board[to] == _EMPTY));
      if (!cap) {
        if (qsearch) {
          if (!depth && (kdir | IsKnightMove(_KING[!color]->sqr, to))) {
            score = (_SQR[to] - _SQR[from] + 20);
            AddMove(KnightMove, from, to, score);
          }
        }
        else {
          score = (_SQR[to] - _SQR[from]);
          AddMove(KnightMove, from, to, score);
        }
      }
      else if (COLOR(cap) != color) {
        score = (ValueOf(cap) + _SQR[to] - _SQR[from] - (8 * KnightMove));
        AddMove(KnightMove, from, to, score, cap);
      }
    }
  }